

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateInfoLoadFromString(HelicsFederateInfo fedInfo,char *args,HelicsError *err)

{
  FederateInfo *this;
  allocator<char> local_51;
  string local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  this = getFedInfo(fedInfo,err);
  if (this != (FederateInfo *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,args,&local_51);
    helics::FederateInfo::loadInfoFromArgs(&local_30,this,&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void helicsFederateInfoLoadFromString(HelicsFederateInfo fedInfo, const char* args, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    try {
        info->loadInfoFromArgs(args);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}